

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall yyFlexLexer::yy_flush_buffer(yyFlexLexer *this,YY_BUFFER_STATE b)

{
  YY_BUFFER_STATE local_30;
  YY_BUFFER_STATE b_local;
  yyFlexLexer *this_local;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    b->yy_n_chars = 0;
    *b->yy_ch_buf = '\0';
    b->yy_ch_buf[1] = '\0';
    b->yy_buf_pos = b->yy_ch_buf;
    b->yy_at_bol = 1;
    b->yy_buffer_status = 0;
    if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
      local_30 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_30 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    if (b == local_30) {
      yy_load_buffer_state(this);
    }
  }
  return;
}

Assistant:

void yyFlexLexer::yy_flush_buffer( YY_BUFFER_STATE b )
/* %endif */
{
    	if ( ! b )
		return;

	b->yy_n_chars = 0;

	/* We always need two end-of-buffer characters.  The first causes
	 * a transition to the end-of-buffer state.  The second causes
	 * a jam in that state.
	 */
	b->yy_ch_buf[0] = YY_END_OF_BUFFER_CHAR;
	b->yy_ch_buf[1] = YY_END_OF_BUFFER_CHAR;

	b->yy_buf_pos = &b->yy_ch_buf[0];

	b->yy_at_bol = 1;
	b->yy_buffer_status = YY_BUFFER_NEW;

	if ( b == YY_CURRENT_BUFFER )
		yy_load_buffer_state(  );
}